

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O2

optional_ptr<duckdb::CatalogEntry,_true> __thiscall
duckdb::CatalogSet::GetEntryInternal(CatalogSet *this,CatalogTransaction transaction,string *name)

{
  ulong uVar1;
  CatalogEntry *pCVar2;
  optional_ptr<duckdb::CatalogEntry,_true> oVar3;
  TransactionException *this_00;
  allocator local_61;
  optional_ptr<duckdb::CatalogEntry,_true> entry_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  entry_value = CatalogEntryMap::GetEntry(&this->map,name);
  if (entry_value.ptr == (CatalogEntry *)0x0) {
    oVar3.ptr = (CatalogEntry *)0x0;
  }
  else {
    pCVar2 = optional_ptr<duckdb::CatalogEntry,_true>::operator*(&entry_value);
    uVar1 = (pCVar2->timestamp).super___atomic_base<unsigned_long>._M_i;
    if (((0x400000000000005f < uVar1) && (transaction.transaction_id != uVar1)) ||
       ((uVar1 < 0x4000000000000060 && (transaction.start_time < uVar1)))) {
      this_00 = (TransactionException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,"Catalog write-write conflict on alter with \"%s\"",&local_61);
      ::std::__cxx11::string::string((string *)&local_58,(string *)&pCVar2->name);
      TransactionException::TransactionException<std::__cxx11::string>(this_00,&local_38,&local_58);
      __cxa_throw(this_00,&TransactionException::typeinfo,::std::runtime_error::~runtime_error);
    }
    oVar3.ptr = (CatalogEntry *)0x0;
    if (pCVar2->deleted == false) {
      oVar3.ptr = pCVar2;
    }
  }
  return (optional_ptr<duckdb::CatalogEntry,_true>)oVar3.ptr;
}

Assistant:

optional_ptr<CatalogEntry> CatalogSet::GetEntryInternal(CatalogTransaction transaction, const string &name) {
	auto entry_value = map.GetEntry(name);
	if (!entry_value) {
		return nullptr;
	}
	auto &catalog_entry = *entry_value;

	// Check if this entry is visible to our snapshot
	if (HasConflict(transaction, catalog_entry.timestamp)) {
		// We intend to create a new version of the entry.
		// Another transaction has already made an edit to this catalog entry, because of limitations in the Catalog we
		// can't create an edit alongside this even if the other transaction might end up getting aborted. So we have to
		// abort the transaction.
		throw TransactionException("Catalog write-write conflict on alter with \"%s\"", catalog_entry.name);
	}
	// The entry is visible to our snapshot, check if it's deleted
	if (catalog_entry.deleted) {
		return nullptr;
	}
	return &catalog_entry;
}